

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

void Smt_PrsReadLines(Smt_Prs_t *p)

{
  char *pStr;
  char *pLim;
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iToken;
  char *pStart;
  Smt_Prs_t *p_local;
  
  iVar1 = Vec_IntSize(&p->vStack);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(&p->vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x322,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  iVar1 = Vec_WecSize(&p->vObjs);
  if (iVar1 != 0) {
    __assert_fail("Vec_WecSize(&p->vObjs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x324,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  iVar1 = Vec_WecSize(&p->vObjs);
  Vec_IntPush(&p->vStack,iVar1);
  Vec_WecPushLevel(&p->vObjs);
  p->pCur = p->pBuffer;
  while (p->pCur < p->pLimit) {
    Smt_PrsSkipSpaces(p);
    if (*p->pCur == '(') {
      iVar1 = Vec_IntEntryLast(&p->vStack);
      pVVar3 = Vec_WecEntry(&p->vObjs,iVar1);
      iVar1 = Vec_WecSize(&p->vObjs);
      iVar1 = Abc_Var2Lit(iVar1,0);
      Vec_IntPush(pVVar3,iVar1);
      iVar1 = Vec_WecSize(&p->vObjs);
      Vec_IntPush(&p->vStack,iVar1);
      Vec_WecPushLevel(&p->vObjs);
    }
    else if (*p->pCur == ')') {
      Vec_IntPop(&p->vStack);
    }
    else {
      pStr = p->pCur;
      Smt_PrsSkipNonSpaces(p);
      if (p->pCur < p->pLimit) {
        pLim = p->pCur;
        p->pCur = pLim + -1;
        iVar1 = Abc_NamStrFindOrAddLim(p->pStrs,pStr,pLim,(int *)0x0);
        iVar2 = Vec_IntEntryLast(&p->vStack);
        pVVar3 = Vec_WecEntry(&p->vObjs,iVar2);
        iVar1 = Abc_Var2Lit(iVar1,1);
        Vec_IntPush(pVVar3,iVar1);
      }
    }
    p->pCur = p->pCur + 1;
  }
  iVar1 = Vec_IntSize(&p->vStack);
  if (iVar1 != 1) {
    __assert_fail("Vec_IntSize(&p->vStack) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x34c,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  iVar1 = Vec_WecSize(&p->vObjs);
  iVar2 = Vec_WecCap(&p->vObjs);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x34d,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  return;
}

Assistant:

void Smt_PrsReadLines( Smt_Prs_t * p )
{
    assert( Vec_IntSize(&p->vStack) == 0 );
    //assert( Vec_WecSize(&p->vDepth) == 0 );
    assert( Vec_WecSize(&p->vObjs) == 0 );
    // add top node at level 0
    //Vec_WecPushLevel( &p->vDepth );
    //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
    // add top node
    Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
    Vec_WecPushLevel( &p->vObjs );
    // add other nodes
    for ( p->pCur = p->pBuffer; p->pCur < p->pLimit; p->pCur++ )
    {
        Smt_PrsSkipSpaces( p );
        if ( *p->pCur == '(' )
        {
            // add new node at this depth
            //assert( Vec_WecSize(&p->vDepth) >= Vec_IntSize(&p->vStack) );
            //if ( Vec_WecSize(&p->vDepth) == Vec_IntSize(&p->vStack) )
            //    Vec_WecPushLevel(&p->vDepth);
            //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
            // add fanin to node on the previous level
            Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(Vec_WecSize(&p->vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
            Vec_WecPushLevel( &p->vObjs );
        }
        else if ( *p->pCur == ')' )
        {
            Vec_IntPop( &p->vStack );
        }
        else  // token
        {
            char * pStart = p->pCur; 
            Smt_PrsSkipNonSpaces( p );
            if ( p->pCur < p->pLimit )
            {
                // add fanin
                int iToken = Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur--, NULL );
                Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(iToken, 1) );
            }
        }
    }
    assert( Vec_IntSize(&p->vStack) == 1 );
    assert( Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs) );
}